

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testchar.c
# Opt level: O2

int testCurrentChar(xmlParserCtxtPtr ctxt,int *len)

{
  int iVar1;
  xmlParserInputPtr pxVar2;
  xmlChar *pxVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  char *__format;
  
  lastError = 0;
  iVar5 = xmlCurrentChar();
  pxVar2 = ctxt->input;
  pxVar2->flags = 0;
  uVar4 = lastError;
  pxVar3 = pxVar2->cur;
  lastError = 0;
  xmlNextChar(ctxt);
  pxVar2 = ctxt->input;
  pxVar2->flags = 0;
  iVar1 = *(int *)&pxVar2->cur;
  pxVar2->cur = pxVar3;
  if ((*pxVar3 == '\0') || (uVar4 == lastError)) {
    if (uVar4 != 0) {
      lastError = uVar4;
      return iVar5;
    }
    uVar6 = iVar1 - (int)pxVar3;
    if (*len == uVar6) {
      lastError = uVar4;
      return iVar5;
    }
    __format = "xmlCurrentChar and xmlNextChar report different lengths: %d %d\n";
    uVar4 = *len;
  }
  else {
    __format = "xmlCurrentChar and xmlNextChar report different errors: %d %d\n";
    uVar6 = lastError;
  }
  fprintf(_stderr,__format,(ulong)uVar4,(ulong)uVar6);
  return -1;
}

Assistant:

static int
testCurrentChar(xmlParserCtxtPtr ctxt, int *len) {
    const xmlChar *oldcur;
    int c, err, len2;

    lastError = 0;
    c = xmlCurrentChar(ctxt, len);
    ctxt->input->flags = 0;
    err = lastError;

    oldcur = ctxt->input->cur;
    lastError = 0;
    xmlNextChar(ctxt);
    ctxt->input->flags = 0;
    len2 = ctxt->input->cur - oldcur;
    ctxt->input->cur = oldcur;

    if ((*ctxt->input->cur != 0) && (err != lastError)) {
        fprintf(stderr, "xmlCurrentChar and xmlNextChar report different "
                "errors: %d %d\n", err, lastError);
        return(-1);
    }

    if ((err == 0) && (*len != len2)) {
        fprintf(stderr, "xmlCurrentChar and xmlNextChar report different "
                "lengths: %d %d\n", *len, len2);
        return(-1);
    }

    lastError = err;

    return(c);
}